

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void ixmlNode_getElementsByTagName(IXML_Node *n,char *tagname,IXML_NodeList **list)

{
  unsigned_short uVar1;
  int iVar2;
  char *__s2;
  IXML_Node *n_00;
  char *name;
  IXML_NodeList **list_local;
  char *tagname_local;
  IXML_Node *n_local;
  
  if ((n != (IXML_Node *)0x0) && (tagname != (char *)0x0)) {
    uVar1 = ixmlNode_getNodeType(n);
    if (uVar1 == 1) {
      __s2 = ixmlNode_getNodeName(n);
      iVar2 = strcmp(tagname,__s2);
      if ((iVar2 == 0) || (iVar2 = strcmp(tagname,"*"), iVar2 == 0)) {
        ixmlNodeList_addToNodeList(list,n);
      }
    }
    n_00 = ixmlNode_getFirstChild(n);
    ixmlNode_getElementsByTagNameRecursive(n_00,tagname,list);
    return;
  }
  __assert_fail("n != NULL && tagname != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/node.c",
                0x4fd,
                "void ixmlNode_getElementsByTagName(IXML_Node *, const char *, IXML_NodeList **)");
}

Assistant:

void ixmlNode_getElementsByTagName(
	IXML_Node *n, const char *tagname, IXML_NodeList **list)
{
	const char *name;

	assert(n != NULL && tagname != NULL);

	if (ixmlNode_getNodeType(n) == eELEMENT_NODE) {
		name = ixmlNode_getNodeName(n);
		if (strcmp(tagname, name) == 0 || strcmp(tagname, "*") == 0) {
			ixmlNodeList_addToNodeList(list, n);
		}
	}
	ixmlNode_getElementsByTagNameRecursive(
		ixmlNode_getFirstChild(n), tagname, list);
}